

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall
GlobOpt::HoistConstantLoadAndPropagateValueBackward
          (GlobOpt *this,Var varConst,Instr *origInstr,Value *value)

{
  ValueNumber VVar1;
  RegOpnd *dst;
  FlowGraph *pFVar2;
  JitArenaAllocator *alloc;
  ValueInfo *pVVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  OpndKind OVar7;
  ValueType type;
  undefined4 *puVar8;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *instr;
  long lVar9;
  StackSym *this_00;
  Value *pVVar10;
  BasicBlock *pBVar11;
  Value *pVVar12;
  Value *pVVar13;
  ulong uVar14;
  undefined1 local_b0 [8];
  InvariantBlockBackwardIterator it;
  
  if (this->prePassLoop != (Loop *)0x0) {
    return value;
  }
  if ((this->currentBlock == this->func->m_fg->blockList) &&
     (bVar5 = IR::Instr::TransfersSrcValue(origInstr), bVar5)) {
    return value;
  }
  uVar14 = (ulong)varConst & 0xffff000000000000;
  bVar5 = ((ulong)varConst & 0x1ffff00000000) != 0x1000000000000;
  if (bVar5 && uVar14 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar6) goto LAB_00458f37;
    *puVar8 = 0;
  }
  if (uVar14 != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x11b7,"(Js::TaggedInt::Is(varConst))","Js::TaggedInt::Is(varConst)");
    if (!bVar6) goto LAB_00458f37;
    *puVar8 = 0;
  }
  sym = StackSym::New(this->func);
  dstOpnd = IR::RegOpnd::New(sym,TyVar,this->func);
  type = ValueType::GetInt(true);
  instr = IR::Instr::NewConstantLoad(dstOpnd,(intptr_t)varConst,type,this->func,(Var)0x0);
  IR::Instr::InsertAfter(this->func->m_fg->blockList->firstInstr,instr);
  if (bVar5 && uVar14 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar5) goto LAB_00458f37;
    *puVar8 = 0;
  }
  if ((uVar14 != 0x1000000000000) || (bVar5 = IsTypeSpecPhaseOff(this->func), bVar5)) {
    BVSparse<Memory::JitArenaAllocator>::Set
              ((this->currentBlock->globOptData).liveVarSyms,(sym->super_Sym).m_id);
    lVar9 = 0x30;
  }
  else {
    instr->m_opcode = Ld_I4;
    dst = (RegOpnd *)instr->m_dst;
    OVar7 = IR::Opnd::GetKind((Opnd *)dst);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) {
LAB_00458f37:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    ToInt32Dst(this,instr,dst,this->currentBlock);
    this_00 = IR::Opnd::GetStackSym(instr->m_dst);
    StackSym::SetIsConst(this_00);
    lVar9 = 0x38;
  }
  pVVar10 = GlobOptBlockData::InsertNewValue
                      (&this->currentBlock->globOptData,value,&dstOpnd->super_Opnd);
  pFVar2 = this->func->m_fg;
  if (this->currentBlock != pFVar2->blockList) {
    it.inclusiveEndBlock = (BasicBlock *)this;
    InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
              ((InvariantBlockBackwardIterator *)local_b0,this,this->currentBlock,pFVar2->blockList,
               (StackSym *)0x0,0,false);
    while ((GlobOpt *)it._24_8_ != it.globOpt) {
      pBVar11 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_b0);
      BVSparse<Memory::JitArenaAllocator>::Set
                (*(BVSparse<Memory::JitArenaAllocator> **)
                  ((long)&(pBVar11->globOptData).symToValueMap + lVar9),(sym->super_Sym).m_id);
      pVVar12 = GlobOptBlockData::FindValue(&pBVar11->globOptData,&sym->super_Sym);
      if (pVVar12 == (Value *)0x0) {
        VVar1 = pVVar10->valueNumber;
        alloc = (JitArenaAllocator *)(it.inclusiveEndBlock)->noImplicitCallNoMissingValuesUses;
        ValueInfo::SetIsShared(pVVar10->valueInfo);
        pVVar3 = pVVar10->valueInfo;
        pVVar12 = (Value *)new<Memory::JitArenaAllocator>(0x10,alloc,0x3f1274);
        pVVar12->valueNumber = VVar1;
        pVVar12->valueInfo = pVVar3;
        GlobOptBlockData::SetValue(&pBVar11->globOptData,pVVar12,&sym->super_Sym);
      }
      InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_b0);
    }
    if (it.invariantSymValue != (Value *)0x0) {
      pVVar12 = *(Value **)&it.blockBV.lastFoundIndex[5].startIndex;
      do {
        pVVar13 = it.invariantSymValue;
        it.invariantSymValue = *(Value **)pVVar13;
        *(Value **)pVVar13 = pVVar12;
        pVVar12 = pVVar13;
      } while (it.invariantSymValue != (Value *)0x0);
      *(Value **)&it.blockBV.lastFoundIndex[5].startIndex = pVVar13;
    }
  }
  return pVVar10;
}

Assistant:

Value *
GlobOpt::HoistConstantLoadAndPropagateValueBackward(Js::Var varConst, IR::Instr * origInstr, Value * value)
{
    if (this->IsLoopPrePass() ||
        ((this->currentBlock == this->func->m_fg->blockList) &&
        origInstr->TransfersSrcValue()))
    {
        return value;
    }

    // Only hoisting taggable int const loads for now. Could be extended to other constants (floats, strings, addr opnds) if we see some benefit.
    Assert(Js::TaggedInt::Is(varConst));

    // Insert a load of the constant at the top of the function
    StackSym *    dstSym = StackSym::New(this->func);
    IR::RegOpnd * constRegOpnd = IR::RegOpnd::New(dstSym, TyVar, this->func);
    IR::Instr *   loadInstr = IR::Instr::NewConstantLoad(constRegOpnd, (intptr_t)varConst, ValueType::GetInt(true), this->func);
    this->func->m_fg->blockList->GetFirstInstr()->InsertAfter(loadInstr);

    // Type-spec the load (Support for floats needs to be added when we start hoisting float constants).
    bool typeSpecedToInt = false;
    if (Js::TaggedInt::Is(varConst) && !IsTypeSpecPhaseOff(this->func))
    {
        typeSpecedToInt = true;
        loadInstr->m_opcode = Js::OpCode::Ld_I4;
        ToInt32Dst(loadInstr, loadInstr->GetDst()->AsRegOpnd(), this->currentBlock);
        loadInstr->GetDst()->GetStackSym()->SetIsConst();
    }
    else
    {
        CurrentBlockData()->liveVarSyms->Set(dstSym->m_id);
    }

    // Add the value (object) to the current block's symToValueMap and propagate the value backward to all relevant blocks so it is available on merges.
    value = CurrentBlockData()->InsertNewValue(value, constRegOpnd);

    BVSparse<JitArenaAllocator>* GlobOptBlockData::*bv;
    bv = typeSpecedToInt ? &GlobOptBlockData::liveInt32Syms : &GlobOptBlockData::liveVarSyms; // Will need to be expanded when we start hoisting float constants.
    if (this->currentBlock != this->func->m_fg->blockList)
    {
        for (InvariantBlockBackwardIterator it(this, this->currentBlock, this->func->m_fg->blockList, nullptr);
             it.IsValid();
             it.MoveNext())
        {
            BasicBlock * block = it.Block();
            (block->globOptData.*bv)->Set(dstSym->m_id);
            if (!block->globOptData.FindValue(dstSym))
            {
                Value *const valueCopy = CopyValue(value, value->GetValueNumber());
                block->globOptData.SetValue(valueCopy, dstSym);
            }
        }
    }

    return value;
}